

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message ** __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableField<google::protobuf::Message*>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  uint32 uVar1;
  
  if (*(long *)(field + 0x60) == 0) {
    SetBit(this,message,field);
  }
  else {
    SetOneofCase(this,message,field);
  }
  uVar1 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1);
}

Assistant:

inline Type* GeneratedMessageReflection::MutableField(
    Message* message, const FieldDescriptor* field) const {
  field->containing_oneof() ?
      SetOneofCase(message, field) : SetBit(message, field);
  return MutableRaw<Type>(message, field);
}